

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

void Prs_CreateSignalOut(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Sig)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  Cba_Ntk_t *p_00;
  Prs_Ntk_t *pNtk_00;
  Prs_Ntk_t *pNtk_01;
  int r;
  
  iVar1 = Abc_Lit2Att2(Sig);
  iVar2 = Abc_Lit2Var2(Sig);
  if (Sig != 0) {
    if (iVar1 != 0) {
      r = 0;
      iVar3 = Cba_NtkNewStrId(p,"_occ%d_",iFon);
      Cba_FonSetName(p,iFon,iVar3);
      Cba_NtkSetMap(p,iVar3,iFon);
      if (iVar1 == 3) {
        p_00 = (Cba_Ntk_t *)pNtk;
        Prs_CatSignals(pNtk,iVar2);
        Vec_IntReverseOrder((Vec_Int_t *)p_00);
        for (iVar1 = 0; iVar1 < Prs_CatSignals::V.nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(&Prs_CatSignals::V,iVar1);
          iVar3 = Abc_Lit2Att2(iVar2);
          iVar2 = Abc_Lit2Var2(iVar2);
          if (iVar3 == 1) {
            iVar3 = Vec_IntEntry(&pNtk->vSlices,iVar2);
            iVar4 = Prs_SliceRange(pNtk,iVar2);
            iVar2 = Cba_NtkRangeSize(p,iVar4);
            iVar5 = Cba_NtkHashRange(p,r + iVar2 + -1,r);
            iVar5 = Prs_CreateSlice(p,iFon,pNtk_01,iVar5);
            p_00 = (Cba_Ntk_t *)&p->vArray0;
            Vec_IntPushThree(&p->vArray0,iVar3,iVar4,iVar5);
LAB_003375ad:
            r = iVar2 + r;
          }
          else {
            if (iVar3 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x622,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
            }
            p_00 = (Cba_Ntk_t *)Cba_NtkStr(p,iVar2);
            iVar3 = strncmp((char *)p_00,"Open_",5);
            if (iVar3 != 0) {
              iVar3 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
              iVar4 = Cba_ObjFon0(p,iVar3);
              Cba_FonSetName(p,iVar4,iVar2);
              iVar2 = Prs_CreateRange(p,iVar4,iVar2);
              iVar4 = Cba_NtkHashRange(p,r + iVar2 + -1,r);
              iVar4 = Prs_CreateSlice(p,iFon,pNtk_00,iVar4);
              p_00 = p;
              Cba_ObjSetFinFon(p,iVar3,0,iVar4);
              goto LAB_003375ad;
            }
            r = r + 1;
          }
        }
        Vec_IntReverseOrder((Vec_Int_t *)p_00);
      }
      else {
        if (iVar1 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x628,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
        }
        iVar1 = Vec_IntEntry(&pNtk->vSlices,iVar2);
        iVar2 = Prs_SliceRange(pNtk,iVar2);
        r = Cba_NtkRangeSize(p,iVar2);
        Vec_IntPushThree(&p->vArray0,iVar1,iVar2,iFon);
      }
      iVar1 = Cba_NtkHashRange(p,r + -1,0);
      Cba_FonSetRange(p,iFon,iVar1);
      return;
    }
    __s1 = Cba_NtkStr(p,iVar2);
    iVar1 = strncmp(__s1,"Open_",5);
    if (iVar1 != 0) {
      Cba_FonSetName(p,iFon,iVar2);
      Prs_CreateRange(p,iFon,iVar2);
      return;
    }
  }
  return;
}

Assistant:

void Prs_CreateSignalOut( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Sig )
{
    int i, iFonNew, NameOut, RangeOut, NameId, RangeId, RangeSize, nBits = 0; 
    Prs_ManType_t SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    int SigValue = Abc_Lit2Var2( Sig );
    if ( !Sig ) return;
    if ( SigType == CBA_PRS_NAME )
    {
        NameId = SigValue;
        if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
            return;
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        return;
    }
    // create name for this fan
    NameOut = Cba_NtkNewStrId( p, "_occ%d_", iFon );
    Cba_FonSetName( p, iFon, NameOut );
    Cba_NtkSetMap( p, NameOut, iFon );
    // consider special cases
    if ( SigType == CBA_PRS_SLICE )
    {
        NameId  = Prs_SliceName(pNtk, SigValue);
        RangeId = Prs_SliceRange(pNtk, SigValue);
        nBits   = Cba_NtkRangeSize(p, RangeId);
        // save this slice
        Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFon );
    }
    else if ( SigType == CBA_PRS_CONCAT )
    {
        Vec_Int_t * vSigs = Prs_CatSignals(pNtk, SigValue);
        Vec_IntReverseOrder( vSigs );
        Vec_IntForEachEntry( vSigs, Sig, i )
        {
            SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
            SigValue = Abc_Lit2Var2( Sig );
            if ( SigType == CBA_PRS_NAME )
            {
                int iObjBuf, iFonBuf;
                // create buffer
                NameId = SigValue;
                if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
                {
                    nBits++;
                    continue;
                }
                iObjBuf   = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                iFonBuf   = Cba_ObjFon0(p, iObjBuf);
                Cba_FonSetName( p, iFonBuf, NameId );
                RangeSize = Prs_CreateRange( p, iFonBuf, NameId );
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                Cba_ObjSetFinFon( p, iObjBuf, 0, iFonNew );
            }
            else if ( SigType == CBA_PRS_SLICE )
            {
                NameId    = Prs_SliceName(pNtk, SigValue);
                RangeId   = Prs_SliceRange(pNtk, SigValue);
                RangeSize = Cba_NtkRangeSize(p, RangeId);
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                // save this slice
                Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFonNew );
            }
            else assert( 0 );
            // increment complete range
            nBits += RangeSize;
        }
        Vec_IntReverseOrder( vSigs );
    }
    else assert( 0 );
    // set the range for the output
    Cba_FonHashRange( p, iFon, nBits-1, 0 );
}